

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::MethodDescriptorProto::SerializeWithCachedSizesToArray
          (MethodDescriptorProto *this,uint8 *target)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  uint8 *puVar4;
  MethodOptions *this_00;
  
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar1 = this->name_;
    *target = '\n';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar4);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->input_type_->_M_dataplus)._M_p,(int)this->input_type_->_M_string_length,
               SERIALIZE);
    psVar1 = this->input_type_;
    *target = '\x12';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar4);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 4) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->output_type_->_M_dataplus)._M_p,(int)this->output_type_->_M_string_length,
               SERIALIZE);
    psVar1 = this->output_type_;
    *target = '\x1a';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar4);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 8) != 0) {
    this_00 = this->options_;
    if (this_00 == (MethodOptions *)0x0) {
      this_00 = *(MethodOptions **)(default_instance_ + 0x28);
    }
    *target = '\"';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(this_00->_cached_size_,target + 1);
    target = MethodOptions::SerializeWithCachedSizesToArray(this_00,puVar4);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* MethodDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string input_type = 2;
  if (has_input_type()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->input_type().data(), this->input_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->input_type(), target);
  }

  // optional string output_type = 3;
  if (has_output_type()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->output_type().data(), this->output_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->output_type(), target);
  }

  // optional .google.protobuf.MethodOptions options = 4;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}